

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QStatusBarPrivate::SBItem>::removeAt(QList<QStatusBarPrivate::SBItem> *this,qsizetype i)

{
  char *in_RSI;
  QList<QStatusBarPrivate::SBItem> *in_RDI;
  
  remove(in_RDI,in_RSI);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }